

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_exception.hpp
# Opt level: O2

void __thiscall
duckdb::ParserException::ParserException<int>(ParserException *this,string *msg,int params)

{
  string local_30;
  
  Exception::ConstructMessage<int>(&local_30,msg,params);
  ParserException(this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit ParserException(const string &msg, ARGS... params) : ParserException(ConstructMessage(msg, params...)) {
	}